

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O3

void dfsfast_preorder(Abc_Ntk_t *pNtk)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long *plVar5;
  long lVar6;
  Abc_Obj_t *__ptr;
  int *piVar7;
  uint uVar8;
  uint *__ptr_00;
  void *pvVar9;
  Vec_Int_t *p;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  void *pvVar13;
  MinRegMan_t *pMVar14;
  int iVar15;
  uint uVar16;
  Flow_Data_t *pFVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  
  uVar8 = pNtk->nObjs;
  __ptr_00 = (uint *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar8 - 1) {
    uVar16 = uVar8;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar16;
  if (uVar16 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar16 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar9;
  p = (Vec_Int_t *)malloc(0x10);
  if (uVar8 - 1 < 0xf) {
    uVar8 = 0x10;
  }
  p->nSize = 0;
  p->nCap = uVar8;
  if (uVar8 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar8 << 2);
  }
  p->pArray = piVar10;
  pMVar14 = pManMR;
  if ((pManMR->maxDelay != 0) && (pVVar11 = pNtk->vObjs, 0 < pVVar11->nSize)) {
    lVar20 = 0;
    do {
      pvVar9 = pVVar11->pArray[lVar20];
      if (pvVar9 != (void *)0x0) {
        if (0 < pMVar14->vTimeEdges[*(uint *)((long)pvVar9 + 0x10)].nSize) {
          pVVar11 = pMVar14->vTimeEdges + *(uint *)((long)pvVar9 + 0x10);
          lVar19 = 0;
          do {
            pFVar17 = pMVar14->pDataArray;
            uVar8 = *(uint *)((long)pVVar11->pArray[lVar19] + 0x10);
            pVVar11 = pFVar17[uVar8].field_1.vNodes;
            if (pVVar11 == (Vec_Ptr_t *)0x0) {
              pVVar11 = (Vec_Ptr_t *)malloc(0x10);
              pVVar11->nCap = 8;
              pVVar11->nSize = 0;
              ppvVar12 = (void **)malloc(0x40);
              pVVar11->pArray = ppvVar12;
              pFVar17[uVar8].field_1.vNodes = pVVar11;
            }
            uVar8 = pVVar11->nSize;
            if (uVar8 == pVVar11->nCap) {
              if ((int)uVar8 < 0x10) {
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(0x80);
                }
                else {
                  ppvVar12 = (void **)realloc(pVVar11->pArray,0x80);
                }
                pVVar11->pArray = ppvVar12;
                pVVar11->nCap = 0x10;
              }
              else {
                if (pVVar11->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc((ulong)uVar8 << 4);
                }
                else {
                  ppvVar12 = (void **)realloc(pVVar11->pArray,(ulong)uVar8 << 4);
                }
                pVVar11->pArray = ppvVar12;
                pVVar11->nCap = uVar8 * 2;
              }
            }
            else {
              ppvVar12 = pVVar11->pArray;
            }
            iVar15 = pVVar11->nSize;
            pVVar11->nSize = iVar15 + 1;
            ppvVar12[iVar15] = pvVar9;
            lVar19 = lVar19 + 1;
            pVVar11 = pManMR->vTimeEdges + *(uint *)((long)pvVar9 + 0x10);
            pMVar14 = pManMR;
          } while (lVar19 < pManMR->vTimeEdges[*(uint *)((long)pvVar9 + 0x10)].nSize);
          pVVar11 = pNtk->vObjs;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pVVar11->nSize);
  }
  pVVar4 = pMVar14->vSinkDistHist;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assert_fail("pManMR->vSinkDistHist",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                  ,0x4d,"void dfsfast_preorder(Abc_Ntk_t *)");
  }
  memset(pVVar4->pArray,0,(long)pVVar4->nSize << 2);
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    lVar20 = 0;
    do {
      pvVar9 = pVVar11->pArray[lVar20];
      if (pvVar9 == (void *)0x0) goto LAB_004d8288;
      uVar8 = *(uint *)((long)pvVar9 + 0x14) & 0xf;
      if ((uVar8 == 3) || (uVar8 == 8)) {
LAB_004d816d:
        uVar8 = __ptr_00[1];
        if (uVar8 == *__ptr_00) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar13 = malloc(0x80);
            }
            else {
              pvVar13 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar13;
            *__ptr_00 = 0x10;
          }
          else {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar13 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar13 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar8 << 4);
            }
            *(void **)(__ptr_00 + 2) = pvVar13;
            *__ptr_00 = uVar8 * 2;
          }
        }
        else {
          pvVar13 = *(void **)(__ptr_00 + 2);
        }
        uVar8 = 0x10000;
        uVar16 = 0xffff;
        iVar15 = 0x72;
LAB_004d824d:
        uVar2 = __ptr_00[1];
        __ptr_00[1] = uVar2 + 1;
        *(void **)((long)pvVar13 + (long)(int)uVar2 * 8) = pvVar9;
        Vec_IntPush(p,iVar15);
        *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar9 + 0x10)].field_0x10 =
             uVar16 & *(uint *)&pManMR->pDataArray[*(uint *)((long)pvVar9 + 0x10)].field_0x10 |
             uVar8;
      }
      else if (pManMR->fIsForward == 0) {
        if ((uVar8 == 2) ||
           ((*(uint *)(pManMR->pDataArray + *(uint *)((long)pvVar9 + 0x10)) & pManMR->constraintMask
            & 0x90) != 0)) {
LAB_004d81e2:
          uVar8 = __ptr_00[1];
          if (uVar8 == *__ptr_00) {
            if ((int)uVar8 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar13 = malloc(0x80);
              }
              else {
                pvVar13 = realloc(*(void **)(__ptr_00 + 2),0x80);
              }
              *(void **)(__ptr_00 + 2) = pvVar13;
              *__ptr_00 = 0x10;
            }
            else {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar13 = malloc((ulong)uVar8 << 4);
              }
              else {
                pvVar13 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar8 << 4);
              }
              *(void **)(__ptr_00 + 2) = pvVar13;
              *__ptr_00 = uVar8 * 2;
            }
          }
          else {
            pvVar13 = *(void **)(__ptr_00 + 2);
          }
          uVar8 = 1;
          uVar16 = 0xffff0000;
          iVar15 = 0x65;
          goto LAB_004d824d;
        }
      }
      else {
        if ((*(uint *)(pManMR->pDataArray + *(uint *)((long)pvVar9 + 0x10)) & pManMR->constraintMask
            & 0x90) != 0) goto LAB_004d816d;
        if (uVar8 == 2) goto LAB_004d81e2;
      }
LAB_004d8288:
      lVar20 = lVar20 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar20 < pVVar11->nSize);
  }
  if (0 < (int)__ptr_00[1]) {
    lVar20 = 0;
    do {
      plVar5 = *(long **)(*(long *)(__ptr_00 + 2) + lVar20 * 8);
      if (plVar5 == (long *)0x0) {
        __assert_fail("pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                      ,0x62,"void dfsfast_preorder(Abc_Ntk_t *)");
      }
      if (p->nSize <= lVar20) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pArray[lVar20] == 0x72) {
        uVar8 = *(uint *)&pManMR->pDataArray[*(uint *)(plVar5 + 2)].field_0x10;
        uVar16 = uVar8 >> 0x10;
        pMVar14 = pManMR;
        if (pManMR->fIsForward == 0) {
          iVar15 = *(int *)((long)plVar5 + 0x2c);
          if (0 < iVar15) {
            lVar19 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[6] + lVar19 * 4) * 8);
              uVar2 = *(uint *)(lVar6 + 0x10);
              uVar3 = *(uint *)&pMVar14->pDataArray[uVar2].field_0x10;
              if ((short)uVar3 == 0) {
                *(uint *)&pMVar14->pDataArray[uVar2].field_0x10 = uVar3 | uVar16 + 1 & 0xffff;
                uVar2 = __ptr_00[1];
                if (uVar2 == *__ptr_00) {
                  if ((int)uVar2 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = 0x10;
                  }
                  else {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar2 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar2 << 4);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = uVar2 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(__ptr_00 + 2);
                }
                uVar2 = __ptr_00[1];
                __ptr_00[1] = uVar2 + 1;
                *(long *)((long)pvVar9 + (long)(int)uVar2 * 8) = lVar6;
                Vec_IntPush(p,0x65);
                iVar15 = *(int *)((long)plVar5 + 0x2c);
                pMVar14 = pManMR;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < iVar15);
          }
        }
        else {
          iVar15 = *(int *)((long)plVar5 + 0x1c);
          if (0 < iVar15) {
            lVar19 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + lVar19 * 4) * 8);
              uVar2 = *(uint *)(lVar6 + 0x10);
              uVar3 = *(uint *)&pMVar14->pDataArray[uVar2].field_0x10;
              if ((short)uVar3 == 0) {
                *(uint *)&pMVar14->pDataArray[uVar2].field_0x10 = uVar3 | uVar16 + 1 & 0xffff;
                uVar2 = __ptr_00[1];
                if (uVar2 == *__ptr_00) {
                  if ((int)uVar2 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = 0x10;
                  }
                  else {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar2 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar2 << 4);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = uVar2 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(__ptr_00 + 2);
                }
                uVar2 = __ptr_00[1];
                __ptr_00[1] = uVar2 + 1;
                *(long *)((long)pvVar9 + (long)(int)uVar2 * 8) = lVar6;
                Vec_IntPush(p,0x65);
                iVar15 = *(int *)((long)plVar5 + 0x1c);
                pMVar14 = pManMR;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < iVar15);
          }
        }
        if ((uVar16 != 1) && (pMVar14->fIsForward != 0)) {
          iVar15 = *(int *)((long)plVar5 + 0x2c);
          if (0 < iVar15) {
            lVar19 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[6] + lVar19 * 4) * 8);
              uVar16 = *(uint *)&pMVar14->pDataArray[*(uint *)(lVar6 + 0x10)].field_0x10;
              if ((uVar16 < 0x10000) && ((*(uint *)(lVar6 + 0x14) & 0xf) != 8)) {
                *(uint *)&pMVar14->pDataArray[*(uint *)(lVar6 + 0x10)].field_0x10 =
                     uVar16 | (uVar8 & 0xffff0000) + 0x10000;
                uVar16 = __ptr_00[1];
                if (uVar16 == *__ptr_00) {
                  if ((int)uVar16 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = 0x10;
                  }
                  else {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar16 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = uVar16 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(__ptr_00 + 2);
                }
                uVar16 = __ptr_00[1];
                __ptr_00[1] = uVar16 + 1;
                *(long *)((long)pvVar9 + (long)(int)uVar16 * 8) = lVar6;
                Vec_IntPush(p,0x72);
                iVar15 = *(int *)((long)plVar5 + 0x2c);
                pMVar14 = pManMR;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < iVar15);
          }
          if (pMVar14->maxDelay != 0) {
            pFVar17 = pMVar14->pDataArray;
            uVar18 = (ulong)*(uint *)(plVar5 + 2);
            pVVar11 = pFVar17[uVar18].field_1.vNodes;
            if ((pVVar11 != (Vec_Ptr_t *)0x0) && (0 < pVVar11->nSize)) {
              lVar19 = 0;
              do {
                pvVar9 = pVVar11->pArray[lVar19];
                uVar16 = *(uint *)((long)pvVar9 + 0x10);
                if (*(uint *)&pFVar17[uVar16].field_0x10 < 0x10000) {
                  *(uint *)&pFVar17[uVar16].field_0x10 =
                       *(uint *)&pFVar17[uVar16].field_0x10 | (uVar8 & 0xffff0000) + 0x10000;
                  uVar16 = __ptr_00[1];
                  if (uVar16 == *__ptr_00) {
                    if ((int)uVar16 < 0x10) {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar13 = malloc(0x80);
                      }
                      else {
                        pvVar13 = realloc(*(void **)(__ptr_00 + 2),0x80);
                      }
                      *(void **)(__ptr_00 + 2) = pvVar13;
                      *__ptr_00 = 0x10;
                    }
                    else {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar13 = malloc((ulong)uVar16 << 4);
                      }
                      else {
                        pvVar13 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
                      }
                      *(void **)(__ptr_00 + 2) = pvVar13;
                      *__ptr_00 = uVar16 * 2;
                    }
                  }
                  else {
                    pvVar13 = *(void **)(__ptr_00 + 2);
                  }
                  uVar16 = __ptr_00[1];
                  __ptr_00[1] = uVar16 + 1;
                  *(void **)((long)pvVar13 + (long)(int)uVar16 * 8) = pvVar9;
                  Vec_IntPush(p,0x72);
                  uVar18 = (ulong)*(uint *)(plVar5 + 2);
                  pMVar14 = pManMR;
                }
                lVar19 = lVar19 + 1;
                pFVar17 = pMVar14->pDataArray;
                pVVar11 = pFVar17[uVar18].field_1.vNodes;
              } while (lVar19 < pVVar11->nSize);
            }
          }
        }
      }
      else if ((*(uint *)((long)plVar5 + 0x14) & 0xf) != 8) {
        uVar8 = *(uint *)&pManMR->pDataArray[*(uint *)(plVar5 + 2)].field_0x10;
        if (uVar8 < 0x10000) {
          *(uint *)&pManMR->pDataArray[*(uint *)(plVar5 + 2)].field_0x10 = uVar8 * 0x10001 + 0x10000
          ;
          uVar16 = __ptr_00[1];
          if (uVar16 == *__ptr_00) {
            if ((int)uVar16 < 0x10) {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar9 = malloc(0x80);
              }
              else {
                pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
              }
              *(void **)(__ptr_00 + 2) = pvVar9;
              *__ptr_00 = 0x10;
            }
            else {
              if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                pvVar9 = malloc((ulong)uVar16 << 4);
              }
              else {
                pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
              }
              *(void **)(__ptr_00 + 2) = pvVar9;
              *__ptr_00 = uVar16 * 2;
            }
          }
          else {
            pvVar9 = *(void **)(__ptr_00 + 2);
          }
          uVar16 = __ptr_00[1];
          __ptr_00[1] = uVar16 + 1;
          *(long **)((long)pvVar9 + (long)(int)uVar16 * 8) = plVar5;
          Vec_IntPush(p,0x72);
        }
        if (pManMR->fIsForward == 0) {
          iVar15 = *(int *)((long)plVar5 + 0x1c);
          pMVar14 = pManMR;
          if (0 < iVar15) {
            lVar19 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + lVar19 * 4) * 8);
              uVar16 = *(uint *)&pMVar14->pDataArray[*(uint *)(lVar6 + 0x10)].field_0x10;
              if (((short)uVar16 == 0) && ((*(uint *)(lVar6 + 0x14) & 0xf) != 8)) {
                *(uint *)&pMVar14->pDataArray[*(uint *)(lVar6 + 0x10)].field_0x10 =
                     uVar16 | uVar8 + 1 & 0xffff;
                uVar16 = __ptr_00[1];
                if (uVar16 == *__ptr_00) {
                  if ((int)uVar16 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc(0x80);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = 0x10;
                  }
                  else {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar9 = malloc((ulong)uVar16 << 4);
                    }
                    else {
                      pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
                    }
                    *(void **)(__ptr_00 + 2) = pvVar9;
                    *__ptr_00 = uVar16 * 2;
                  }
                }
                else {
                  pvVar9 = *(void **)(__ptr_00 + 2);
                }
                uVar16 = __ptr_00[1];
                __ptr_00[1] = uVar16 + 1;
                *(long *)((long)pvVar9 + (long)(int)uVar16 * 8) = lVar6;
                Vec_IntPush(p,0x65);
                iVar15 = *(int *)((long)plVar5 + 0x1c);
                pMVar14 = pManMR;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < iVar15);
          }
          if (pMVar14->maxDelay != 0) {
            pFVar17 = pMVar14->pDataArray;
            uVar18 = (ulong)*(uint *)(plVar5 + 2);
            pVVar11 = pFVar17[uVar18].field_1.vNodes;
            if ((pVVar11 != (Vec_Ptr_t *)0x0) && (0 < pVVar11->nSize)) {
              lVar19 = 0;
              do {
                pvVar9 = pVVar11->pArray[lVar19];
                uVar16 = *(uint *)((long)pvVar9 + 0x10);
                if ((short)*(uint *)&pFVar17[uVar16].field_0x10 == 0) {
                  *(uint *)&pFVar17[uVar16].field_0x10 =
                       *(uint *)&pFVar17[uVar16].field_0x10 | uVar8 + 1 & 0xffff;
                  uVar16 = __ptr_00[1];
                  if (uVar16 == *__ptr_00) {
                    if ((int)uVar16 < 0x10) {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar13 = malloc(0x80);
                      }
                      else {
                        pvVar13 = realloc(*(void **)(__ptr_00 + 2),0x80);
                      }
                      *(void **)(__ptr_00 + 2) = pvVar13;
                      *__ptr_00 = 0x10;
                    }
                    else {
                      if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                        pvVar13 = malloc((ulong)uVar16 << 4);
                      }
                      else {
                        pvVar13 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
                      }
                      *(void **)(__ptr_00 + 2) = pvVar13;
                      *__ptr_00 = uVar16 * 2;
                    }
                  }
                  else {
                    pvVar13 = *(void **)(__ptr_00 + 2);
                  }
                  uVar16 = __ptr_00[1];
                  __ptr_00[1] = uVar16 + 1;
                  *(void **)((long)pvVar13 + (long)(int)uVar16 * 8) = pvVar9;
                  Vec_IntPush(p,0x65);
                  uVar18 = (ulong)*(uint *)(plVar5 + 2);
                  pMVar14 = pManMR;
                }
                lVar19 = lVar19 + 1;
                pFVar17 = pMVar14->pDataArray;
                pVVar11 = pFVar17[uVar18].field_1.vNodes;
              } while (lVar19 < pVVar11->nSize);
            }
          }
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (int)__ptr_00[1]);
    pVVar11 = pNtk->vObjs;
  }
  uVar18 = (ulong)(uint)pVVar11->nSize;
  if (pManMR->maxDelay != 0) {
    if (pVVar11->nSize < 1) goto LAB_004d8c14;
    lVar20 = 0;
    do {
      pvVar9 = pVVar11->pArray[lVar20];
      if ((pvVar9 != (void *)0x0) &&
         (__ptr = pManMR->pDataArray[*(uint *)((long)pvVar9 + 0x10)].field_1.pred,
         __ptr != (Abc_Obj_t *)0x0)) {
        if (__ptr->pNext != (Abc_Obj_t *)0x0) {
          free(__ptr->pNext);
        }
        free(__ptr);
        pManMR->pDataArray[*(uint *)((long)pvVar9 + 0x10)].field_1.pred = (Abc_Obj_t *)0x0;
        pVVar11 = pNtk->vObjs;
      }
      lVar20 = lVar20 + 1;
      uVar18 = (ulong)pVVar11->nSize;
    } while (lVar20 < (long)uVar18);
  }
  pMVar14 = pManMR;
  if (0 < (int)uVar18) {
    ppvVar12 = pVVar11->pArray;
    lVar20 = 0;
    do {
      pvVar9 = ppvVar12[lVar20];
      if (pvVar9 != (void *)0x0) {
        pVVar4 = pMVar14->vSinkDistHist;
        pFVar17 = pMVar14->pDataArray;
        uVar1 = *(ushort *)&pFVar17[*(uint *)((long)pvVar9 + 0x10)].field_0x12;
        if (pVVar4->nSize <= (int)(uint)uVar1) {
LAB_004d8c8d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar7 = pVVar4->pArray;
        piVar10 = piVar7 + uVar1;
        *piVar10 = *piVar10 + 1;
        uVar1 = *(ushort *)&pFVar17[*(uint *)((long)pvVar9 + 0x10)].field_0x10;
        if (pVVar4->nSize <= (int)(uint)uVar1) goto LAB_004d8c8d;
        piVar7 = piVar7 + uVar1;
        *piVar7 = *piVar7 + 1;
        uVar18 = (ulong)(uint)pVVar11->nSize;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < (int)uVar18);
  }
LAB_004d8c14:
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void dfsfast_preorder( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj, *pNext;
  Vec_Ptr_t *vTimeIn, *qn = Vec_PtrAlloc(Abc_NtkObjNum(pNtk));
  Vec_Int_t *qe = Vec_IntAlloc(Abc_NtkObjNum(pNtk));
  int i, j, d = 0, end;
  int qpos = 0;

  // create reverse timing edges for backward traversal
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      Vec_PtrForEachEntry( Abc_Obj_t *, FTIMEEDGES(pObj), pNext, j ) {
        vTimeIn = FDATA(pNext)->vNodes;
        if (!vTimeIn) {
          vTimeIn = FDATA(pNext)->vNodes = Vec_PtrAlloc(2);
        }
        Vec_PtrPush(vTimeIn, pObj);
      }
    }
  }
#endif

  // clear histogram
  assert(pManMR->vSinkDistHist);
  memset(Vec_IntArray(pManMR->vSinkDistHist), 0, sizeof(int)*Vec_IntSize(pManMR->vSinkDistHist));

  // seed queue : latches, PIOs, and blocks
  Abc_NtkForEachObj( pNtk, pObj, i )
    if (Abc_ObjIsPo(pObj) ||
        Abc_ObjIsLatch(pObj) || 
        (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'r');
      FDATA(pObj)->r_dist = 1;
    } else if (Abc_ObjIsPi(pObj) || 
               (!pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
      Vec_PtrPush(qn, pObj);
      Vec_IntPush(qe, 'e');
      FDATA(pObj)->e_dist = 1;
    }

  // until queue is empty...
  while(qpos < Vec_PtrSize(qn)) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(qn, qpos);
    assert(pObj);
    end = Vec_IntEntry(qe, qpos);
    qpos++;
    
    if (end == 'r') {
      d = FDATA(pObj)->r_dist;

      // 1. structural edges
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }
      } else
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }

      if (d == 1) continue;

      // 2. reverse edges (forward retiming only)
      if (pManMR->fIsForward) {
        Abc_ObjForEachFanout( pObj, pNext, i )
          if (!FDATA(pNext)->r_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->r_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'r');
          }          

      // 3. timimg edges (forward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->r_dist) {
              FDATA(pNext)->r_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'r');
            }
          }
#endif
      }
      
    } else { // if 'e'
      if (Abc_ObjIsLatch(pObj)) continue;

      d = FDATA(pObj)->e_dist;

      // 1. through node
      if (!FDATA(pObj)->r_dist) {
        FDATA(pObj)->r_dist = d+1;
        Vec_PtrPush(qn, pObj);
        Vec_IntPush(qe, 'r');
      }

      // 2. reverse edges (backward retiming only)
      if (!pManMR->fIsForward) {
        Abc_ObjForEachFanin( pObj, pNext, i )
          if (!FDATA(pNext)->e_dist && !Abc_ObjIsLatch(pNext)) {
            FDATA(pNext)->e_dist = d+1;
            Vec_PtrPush(qn, pNext);
            Vec_IntPush(qe, 'e');
          }  

      // 3. timimg edges (backward retiming only)
#if !defined(IGNORE_TIMING)
        if (pManMR->maxDelay && FDATA(pObj)->vNodes)
          Vec_PtrForEachEntry(Abc_Obj_t *, FDATA(pObj)->vNodes, pNext, i ) {
            if (!FDATA(pNext)->e_dist) {
              FDATA(pNext)->e_dist = d+1;
              Vec_PtrPush(qn, pNext);
              Vec_IntPush(qe, 'e');
            }
          }
#endif
      }
    }
  }
 
  // free time edges
#if !defined(IGNORE_TIMING)
  if (pManMR->maxDelay) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      vTimeIn = FDATA(pObj)->vNodes;
      if (vTimeIn) {
        Vec_PtrFree(vTimeIn);
        FDATA(pObj)->vNodes = 0;
      }
    }
  }
#endif

  Abc_NtkForEachObj( pNtk, pObj, i ) {
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->r_dist, 1);
    Vec_IntAddToEntry(pManMR->vSinkDistHist, FDATA(pObj)->e_dist, 1);

#ifdef DEBUG_PREORDER
    printf("node %d\t: r=%d\te=%d\n", Abc_ObjId(pObj), FDATA(pObj)->r_dist, FDATA(pObj)->e_dist);
#endif
  }

  // printf("\t\tpre-ordered (max depth=%d)\n", d+1);

  // deallocate
  Vec_PtrFree( qn );
  Vec_IntFree( qe );
}